

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O2

cl_mem xmrig::OclLib::createBuffer
                 (cl_context context,cl_mem_flags flags,size_t size,void *host_ptr,
                 cl_int *errcode_ret)

{
  cl_mem p_Var1;
  char *pcVar2;
  char *pcVar3;
  
  p_Var1 = (*pCreateBuffer)(context,flags,size,host_ptr,errcode_ret);
  if (*errcode_ret != 0) {
    pcVar2 = ocl_tag();
    pcVar3 = OclError::toString(*errcode_ret);
    p_Var1 = (cl_mem)0x0;
    Log::print(ERR,
               "%s\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m with buffer size \x1b[0m\x1b[1;31m%zu\x1b[0m"
               ,pcVar2,pcVar3,"clCreateBuffer",size);
  }
  return p_Var1;
}

Assistant:

cl_mem xmrig::OclLib::createBuffer(cl_context context, cl_mem_flags flags, size_t size, void *host_ptr, cl_int *errcode_ret) noexcept
{
    assert(pCreateBuffer != nullptr);

    auto result = pCreateBuffer(context, flags, size, host_ptr, errcode_ret);
    if (*errcode_ret != CL_SUCCESS) {
        LOG_ERR("%s" RED(" error ") RED_BOLD("%s") RED(" when calling ") RED_BOLD("%s") RED(" with buffer size ") RED_BOLD("%zu"),
                ocl_tag(), OclError::toString(*errcode_ret), kCreateBuffer, size);

        return nullptr;
    }

    return result;
}